

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

ssize_t libssh2_sftp_read(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen)

{
  size_t *psVar1;
  void **ppvVar2;
  libssh2_nonblocking_states lVar3;
  LIBSSH2_SESSION *pLVar4;
  uint value;
  _libssh2_sftp_handle_data *p_Var5;
  uchar *puVar6;
  ulong uVar7;
  uint32_t uVar8;
  int iVar9;
  unsigned_long uVar10;
  list_node *plVar11;
  uchar *puVar12;
  list_node *plVar13;
  long lVar14;
  ulong uVar15;
  ssize_t sVar16;
  char *pcVar17;
  list_node *plVar18;
  list_node *plVar19;
  list_node *plVar20;
  LIBSSH2_SFTP *pLVar21;
  list_head *head;
  bool bVar22;
  bool bVar23;
  uchar *s;
  LIBSSH2_SFTP_HANDLE *pLVar24;
  uchar *local_88;
  LIBSSH2_SFTP *local_80;
  list_node *local_78;
  list_head *local_70;
  uchar *local_68;
  uint32_t local_5c;
  ulong local_58;
  char *local_50;
  LIBSSH2_CHANNEL *local_48;
  char *local_40;
  time_t local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sVar16 = -0x27;
  }
  else {
    local_78 = (list_node *)buffer_maxlen;
    local_50 = buffer;
    local_38 = time((time_t *)0x0);
    local_58 = 0x800000;
    if ((ulong)((long)local_78 * 4) < 0x800000) {
      local_58 = (long)local_78 * 4;
    }
    local_5c = (int)local_58 * 8;
    local_40 = hnd->handle;
    head = &hnd->packet_list;
    pLVar24 = hnd;
    local_70 = head;
    do {
      uVar7 = local_58;
      pLVar21 = hnd->sftp;
      local_48 = pLVar21->channel;
      pLVar4 = local_48->session;
      lVar3 = pLVar21->read_state;
      if (lVar3 == libssh2_NB_state_sent2) {
LAB_00124afb:
        pLVar21->read_state = libssh2_NB_state_idle;
        local_80 = pLVar21;
        plVar18 = (list_node *)_libssh2_list_first(head);
        if (plVar18 == (list_node *)0x0) {
LAB_00124c98:
          pcVar17 = "sftp_read() internal error";
LAB_00124ca9:
          iVar9 = _libssh2_error(pLVar4,-0x1f,pcVar17);
LAB_00124cae:
          plVar19 = (list_node *)(long)iVar9;
        }
        else {
          plVar19 = (list_node *)0x0;
          pcVar17 = local_50;
          hnd = pLVar24;
          while (local_68 = (uchar *)0x0, plVar11 = plVar19, plVar18[2].next == (list_node *)0x0) {
            iVar9 = sftp_packet_requirev
                              (local_80,0x133b4a,(uchar *)(ulong)*(uint *)&plVar18[2].prev,
                               (uint32_t)&local_88,&local_68,(size_t *)0x9,(size_t)hnd);
            pLVar24 = hnd;
            if ((iVar9 == -0x25) && (plVar19 != (list_node *)0x0)) goto LAB_00124dc0;
            if (iVar9 == -0x26) {
              if (local_68 != (uchar *)0x0) {
                (*pLVar4->free)(local_88,&pLVar4->abstract);
              }
              pcVar17 = "Response too small";
              goto LAB_00124ca9;
            }
            if (iVar9 < 0) {
              plVar19 = (list_node *)(long)iVar9;
              local_80->read_state = libssh2_NB_state_sent2;
              goto LAB_00124dc0;
            }
            if (*local_88 != 'g') {
              if (*local_88 == 'e') {
                _libssh2_list_remove(plVar18);
                (*pLVar4->free)(plVar18,&pLVar4->abstract);
                pLVar24 = hnd;
                sftp_packetlist_flush(hnd);
                uVar8 = _libssh2_ntohu32(local_88 + 5);
                (*pLVar4->free)(local_88,&pLVar4->abstract);
                if (uVar8 == 1) {
                  (hnd->u).file.eof = '\x01';
                }
                else {
                  local_80->last_errno = uVar8;
                  iVar9 = _libssh2_error(pLVar4,-0x1f,"SFTP READ error");
                  plVar19 = (list_node *)(long)iVar9;
                }
              }
              else {
                pcVar17 = "SFTP Protocol badness: unrecognised read request response";
LAB_00124db4:
                iVar9 = _libssh2_error(pLVar4,-0x1f,pcVar17);
                plVar19 = (list_node *)(long)iVar9;
                pLVar24 = hnd;
              }
              goto LAB_00124dc0;
            }
            if (plVar18[1].next != (list_node *)(hnd->u).file.offset) {
              pcVar17 = "Read Packet At Unexpected Offset";
              goto LAB_00124db4;
            }
            uVar8 = _libssh2_ntohu32(local_88 + 5);
            puVar6 = local_88;
            plVar20 = (list_node *)(ulong)uVar8;
            if ((list_node *)(local_68 + -9) < plVar20) {
              pcVar17 = "SFTP Protocol badness";
              goto LAB_00124db4;
            }
            lVar14 = (long)plVar20 - (long)plVar18[1].prev;
            if (plVar18[1].prev <= plVar20 && lVar14 != 0) {
              pcVar17 = "FXP_READ response too big";
              goto LAB_00124db4;
            }
            if (lVar14 != 0) {
              ppvVar2 = &(hnd->u).dir.names_packet;
              *ppvVar2 = (void *)((long)*ppvVar2 + lVar14);
            }
            plVar11 = (list_node *)((long)&plVar20->next + (long)&plVar19->next);
            if (plVar11 < local_78 || (long)plVar11 - (long)local_78 == 0) {
              puVar12 = (uchar *)0x0;
            }
            else {
              (hnd->u).file.data_left = (long)plVar11 - (long)local_78;
              plVar20 = (list_node *)(ulong)(uint)((int)local_78 - (int)plVar19);
              (hnd->u).file.data = local_88;
              plVar11 = (list_node *)((long)&plVar20->next + (long)&plVar19->next);
              puVar12 = local_68;
            }
            (hnd->u).file.data_len = (size_t)puVar12;
            pLVar24 = hnd;
            memcpy(pcVar17,local_88 + 9,(size_t)plVar20);
            (hnd->u).file.offset = (long)&plVar20->next + (hnd->u).file.offset;
            p_Var5 = &hnd->u;
            hnd = pLVar24;
            if ((p_Var5->file).data_len == 0) {
              (*pLVar4->free)(puVar6,&pLVar4->abstract);
              hnd = pLVar24;
            }
            plVar13 = (list_node *)_libssh2_list_next(plVar18);
            _libssh2_list_remove(plVar18);
            (*pLVar4->free)(plVar18,&pLVar4->abstract);
            head = local_70;
            if ((local_78 <= plVar11) ||
               (pcVar17 = pcVar17 + (long)plVar20, plVar19 = plVar11, plVar18 = plVar13,
               plVar13 == (list_node *)0x0)) break;
          }
          plVar19 = plVar11;
          pLVar24 = hnd;
          if (plVar11 == (list_node *)0x0) goto LAB_00124c98;
        }
LAB_00124dc0:
        if (plVar19 != (list_node *)0xffffffffffffffdb) {
          return (ssize_t)plVar19;
        }
      }
      else {
        if (lVar3 == libssh2_NB_state_sent) {
LAB_00124a8b:
          pLVar21->read_state = libssh2_NB_state_idle;
          for (plVar18 = (list_node *)_libssh2_list_first(head); plVar18 != (list_node *)0x0;
              plVar18 = (list_node *)_libssh2_list_next(plVar18)) {
            while (plVar18[2].next != (list_node *)0x0) {
              plVar19 = (list_node *)
                        _libssh2_channel_write
                                  (local_48,0,
                                   (undefined1 *)((long)&plVar18[2].prev + 4) +
                                   (long)&(plVar18[1].head)->last,(size_t)plVar18[2].next);
              if ((long)plVar19 < 0) {
                pLVar21->read_state = libssh2_NB_state_sent;
                goto LAB_00124dc0;
              }
              plVar18[1].head = (list_head *)((long)&plVar19->next + (long)&(plVar18[1].head)->last)
              ;
              plVar11 = plVar18 + 2;
              plVar11->next = (list_node *)((long)plVar11->next - (long)plVar19);
              if (plVar11->next == (list_node *)0x0) break;
              plVar19 = (list_node *)_libssh2_list_first(head);
              if (plVar18 != plVar19) goto LAB_00124afb;
            }
          }
          goto LAB_00124afb;
        }
        if (lVar3 != libssh2_NB_state_idle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                        ,0x6fa,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        pLVar21->last_errno = 0;
        plVar18 = (list_node *)(hnd->u).file.data_left;
        if (plVar18 != (list_node *)0x0) {
          plVar19 = local_78;
          if (plVar18 < local_78) {
            plVar19 = plVar18;
          }
          memcpy(local_50,(hnd->u).file.data + ((hnd->u).file.data_len - (long)plVar18),
                 (size_t)plVar19);
          (hnd->u).file.offset = (long)&plVar19->next + (hnd->u).file.offset;
          psVar1 = &(hnd->u).file.data_left;
          *psVar1 = *psVar1 - (long)plVar19;
          if (*psVar1 == 0) {
            (*pLVar4->free)((hnd->u).file.data,&pLVar4->abstract);
            (hnd->u).file.data = (uchar *)0x0;
          }
          goto LAB_00124dc0;
        }
        if ((hnd->u).file.eof != '\0') {
          return 0;
        }
        uVar15 = (long)(hnd->u).dir.names_packet - (hnd->u).file.offset;
        plVar18 = (list_node *)(local_58 - uVar15);
        if (local_58 < uVar15) {
          plVar18 = (list_node *)0x0;
        }
        local_80 = pLVar21;
        uVar10 = libssh2_channel_window_read_ex(local_48,(unsigned_long *)0x0,(unsigned_long *)0x0);
        pLVar21 = local_80;
        if ((uVar7 <= uVar10) ||
           (iVar9 = _libssh2_channel_receive_window_adjust
                              (local_80->channel,local_5c,'\x01',(uint *)0x0), iVar9 == 0)) {
          if (uVar15 < local_58) {
            do {
              plVar19 = local_78;
              iVar9 = (int)hnd->handle_len;
              plVar20 = (list_node *)(ulong)(iVar9 + 0x19);
              plVar11 = (list_node *)(*pLVar4->alloc)((size_t)&plVar20[2].head,&pLVar4->abstract);
              if (plVar11 == (list_node *)0x0) {
                iVar9 = _libssh2_error(pLVar4,-6,"malloc fail for FXP_WRITE");
                plVar19 = (list_node *)(long)iVar9;
                head = local_70;
                goto LAB_00124dc0;
              }
              if (plVar19 <= (list_node *)((ulong)plVar18 & 0xffffffff)) {
                plVar19 = plVar18;
              }
              value = (uint)plVar19;
              if (29999 < (uint)plVar19) {
                value = 30000;
              }
              plVar19 = (list_node *)(ulong)value;
              plVar11[1].next = (list_node *)(hnd->u).file.offset_sent;
              plVar11[1].prev = plVar19;
              plVar11[2].next = plVar20;
              plVar11[1].head = (list_head *)0x0;
              local_88 = (uchar *)((long)&plVar11[2].prev + 4);
              _libssh2_store_u32(&local_88,iVar9 + 0x15);
              pLVar21 = local_80;
              *local_88 = '\x05';
              uVar8 = local_80->request_id;
              local_80->request_id = uVar8 + 1;
              *(uint32_t *)&plVar11[2].prev = uVar8;
              local_88 = local_88 + 1;
              _libssh2_store_u32(&local_88,uVar8);
              _libssh2_store_str(&local_88,local_40,hnd->handle_len);
              _libssh2_store_u64(&local_88,(hnd->u).file.offset_sent);
              ppvVar2 = &(hnd->u).dir.names_packet;
              *ppvVar2 = (void *)((long)&plVar19->next + (long)*ppvVar2);
              _libssh2_store_u32(&local_88,value);
              head = local_70;
              _libssh2_list_add(local_70,plVar11);
              bVar22 = plVar19 <= plVar18;
              plVar18 = (list_node *)((long)plVar18 - (long)plVar19);
              bVar23 = plVar18 != (list_node *)0x0;
              if (!bVar22) {
                plVar18 = (list_node *)0x0;
              }
            } while (bVar22 && bVar23);
          }
          goto LAB_00124a8b;
        }
        if (iVar9 != -0x25) goto LAB_00124cae;
        if ((hnd->u).file.data_left != 0) {
          __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left",
                        "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                        ,0x5f4,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        if ((hnd->u).file.eof != '\0') {
          __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->eof",
                        "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                        ,0x5f5,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
      }
      pLVar4 = hnd->sftp->channel->session;
      if (pLVar4 == (LIBSSH2_SESSION *)0x0) {
        return -0x25;
      }
      if (pLVar4->api_block_mode == 0) {
        return -0x25;
      }
      iVar9 = _libssh2_wait_socket(pLVar4,local_38);
    } while (iVar9 == 0);
    sVar16 = (ssize_t)iVar9;
  }
  return sVar16;
}

Assistant:

static ssize_t sftp_read(LIBSSH2_SFTP_HANDLE * handle, char *buffer,
                         size_t buffer_size)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t count = 0;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    ssize_t rc;
    struct _libssh2_sftp_handle_file_data *filep =
        &handle->u.file;
    size_t bytes_in_buffer = 0;
    char *sliding_bufferp = buffer;

    /* This function can be interrupted in three different places where it
       might need to wait for data from the network.  It returns EAGAIN to
       allow non-blocking clients to do other work but these client are
       expected to call this function again (possibly many times) to finish
       the operation.

       The tricky part is that if we previously aborted a sftp_read due to
       EAGAIN, we must continue at the same spot to continue the previously
       interrupted operation.  This is done using a state machine to record
       what phase of execution we were at.  The state is stored in
       sftp->read_state.

       libssh2_NB_state_idle: The first phase is where we prepare multiple
       FXP_READ packets to do optimistic read-ahead.  We send off as many as
       possible in the second phase without waiting for a response to each
       one; this is the key to fast reads. But we may have to adjust the
       channel window size to do this which may interrupt this function while
       waiting.  The state machine saves the phase as libssh2_NB_state_idle so
       it returns here on the next call.

       libssh2_NB_state_sent: The second phase is where we send the FXP_READ
       packets.  Writing them to the channel can be interrupted with EAGAIN
       but the state machine ensures we skip the first phase on the next call
       and resume sending.

       libssh2_NB_state_sent2: In the third phase (indicated by ) we read the
       data from the responses that have arrived so far.  Reading can be
       interrupted with EAGAIN but the state machine ensures we skip the first
       and second phases on the next call and resume sending.
    */

    switch(sftp->read_state) {
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Some data may already have been read from the server in the
           previous call but didn't fit in the buffer at the time.  If so, we
           return that now as we can't risk being interrupted later with data
           partially written to the buffer. */
        if(filep->data_left) {
            size_t copy = LIBSSH2_MIN(buffer_size, filep->data_left);

            memcpy(buffer, &filep->data[ filep->data_len - filep->data_left],
                   copy);

            filep->data_left -= copy;
            filep->offset += copy;

            if(!filep->data_left) {
                LIBSSH2_FREE(session, filep->data);
                filep->data = NULL;
            }

            return copy;
        }

        if(filep->eof) {
            return 0;
        }
        else {
            /* We allow a number of bytes being requested at any given time
               without having been acked - until we reach EOF. */

            /* Number of bytes asked for that haven't been acked yet */
            size_t already = (size_t)(filep->offset_sent - filep->offset);

            size_t max_read_ahead = buffer_size*4;
            unsigned long recv_window;

            if(max_read_ahead > LIBSSH2_CHANNEL_WINDOW_DEFAULT*4)
                max_read_ahead = LIBSSH2_CHANNEL_WINDOW_DEFAULT*4;

            /* if the buffer_size passed in now is smaller than what has
               already been sent, we risk getting count become a very large
               number */
            if(max_read_ahead > already)
                count = max_read_ahead - already;

            /* 'count' is how much more data to ask for, and 'already' is how
               much data that already has been asked for but not yet returned.
               Specifically, 'count' means how much data that have or will be
               asked for by the nodes that are already added to the linked
               list. Some of those read requests may not actually have been
               sent off successfully yet.

               If 'already' is very large it should be perfectly fine to have
               count set to 0 as then we don't have to ask for more data
               (right now).

               buffer_size*4 is just picked more or less out of the air. The
               idea is that when reading SFTP from a remote server, we send
               away multiple read requests guessing that the client will read
               more than only this 'buffer_size' amount of memory. So we ask
               for maximum buffer_size*4 amount of data so that we can return
               them very fast in subsequent calls.
            */

            recv_window = libssh2_channel_window_read_ex(sftp->channel,
                                                         NULL, NULL);
            if(max_read_ahead > recv_window) {
                /* more data will be asked for than what the window currently
                   allows, expand it! */

                rc = _libssh2_channel_receive_window_adjust(sftp->channel,
                                               (uint32_t)(max_read_ahead * 8),
                                               1, NULL);
                /* if this returns EAGAIN, we will get back to this function
                   at next call */
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left);
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->eof);
                if(rc)
                    return rc;
            }
        }

        while(count > 0) {
            unsigned char *s;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            uint32_t packet_len = (uint32_t)(handle->handle_len + 25);
            uint32_t request_id;

            uint32_t size = (uint32_t)count;
            if(size < buffer_size)
                size = (uint32_t)buffer_size;
            if(size > MAX_SFTP_READ_SIZE)
                size = MAX_SFTP_READ_SIZE;

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->offset = filep->offset_sent;
            chunk->len = size;
            chunk->lefttosend = packet_len;
            chunk->sent = 0;

            s = chunk->packet;

            _libssh2_store_u32(&s, packet_len - 4);
            *s++ = SSH_FXP_READ;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, filep->offset_sent);
            filep->offset_sent += size; /* advance offset at once */
            _libssh2_store_u32(&s, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);
            /* deduct the size we used, as we might have to create
               more packets */
            count -= LIBSSH2_MIN(size, count);
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "read request id %d sent (offset: %lu, size: %lu)",
                           request_id, (unsigned long)chunk->offset,
                           (unsigned long)chunk->len));
        }
        LIBSSH2_FALLTHROUGH();
    case libssh2_NB_state_sent:

        sftp->read_state = libssh2_NB_state_idle;

        /* move through the READ packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {

                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0) {
                    sftp->read_state = libssh2_NB_state_sent;
                    return rc;
                }

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend) {
                    /* We still have data left to send for this chunk.
                     * If there is at least one completely sent chunk,
                     * we can get out of this loop and start reading.  */
                    if(chunk != _libssh2_list_first(&handle->packet_list)) {
                        break;
                    }
                    else {
                        continue;
                    }
                }
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }
        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent2:

        sftp->read_state = libssh2_NB_state_idle;

        /*
         * Count all ACKed packets and act on the contents of them.
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            unsigned char *data;
            size_t data_len = 0;
            uint32_t rc32;
            static const unsigned char read_responses[2] = {
                SSH_FXP_DATA, SSH_FXP_STATUS
            };

            if(chunk->lefttosend) {
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                if(bytes_in_buffer > 0) {
                    return bytes_in_buffer;
                }
                else {
                    /* we should never reach this point */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "sftp_read() internal error");
                }
            }

            rc = sftp_packet_requirev(sftp, 2, read_responses,
                                      chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_EAGAIN && bytes_in_buffer) {
                /* do not return EAGAIN if we have already
                 * written data into the buffer */
                return bytes_in_buffer;
            }

            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "Response too small");
            }
            else if(rc < 0) {
                sftp->read_state = libssh2_NB_state_sent2;
                return rc;
            }

            /*
             * We get DATA or STATUS back. STATUS can be error, or it is
             * FX_EOF when we reach the end of the file.
             */

            switch(data[0]) {
            case SSH_FXP_STATUS:
                /* remove the chunk we just processed */

                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* we must remove all outstanding READ requests, as either we
                   got an error or we're at end of file */
                sftp_packetlist_flush(handle);

                rc32 = _libssh2_ntohu32(data + 5);
                LIBSSH2_FREE(session, data);

                if(rc32 == LIBSSH2_FX_EOF) {
                    filep->eof = TRUE;
                    return bytes_in_buffer;
                }
                else {
                    sftp->last_errno = rc32;
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP READ error");
                }

            case SSH_FXP_DATA:
                if(chunk->offset != filep->offset) {
                    /* This could happen if the server returns less bytes than
                       requested, which shouldn't happen for normal files. See:
                       https://tools.ietf.org/html/draft-ietf-secsh-filexfer-02
                       #section-6.4
                     */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "Read Packet At Unexpected Offset");
                }

                rc32 = _libssh2_ntohu32(data + 5);
                if(rc32 > (data_len - 9))
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP Protocol badness");

                if(rc32 > chunk->len) {
                    /* A chunk larger than we requested was returned to us.
                       This is a protocol violation and we don't know how to
                       deal with it. Bail out! */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "FXP_READ response too big");
                }

                if(rc32 != chunk->len) {
                    /* a short read does not imply end of file, but we must
                       adjust the offset_sent since it was advanced with a
                       full chunk->len before */
                    filep->offset_sent -= (chunk->len - rc32);
                }

                if((bytes_in_buffer + rc32) > buffer_size) {
                    /* figure out the overlap amount */
                    filep->data_left = (bytes_in_buffer + rc32) - buffer_size;

                    /* getting the full packet would overflow the buffer, so
                       only get the correct amount and keep the remainder */
                    rc32 = (uint32_t)(buffer_size - bytes_in_buffer);

                    /* store data to keep for next call */
                    filep->data = data;
                    filep->data_len = data_len;
                }
                else
                    filep->data_len = 0;

                /* copy the received data from the received FXP_DATA packet to
                   the buffer at the correct index */
                memcpy(sliding_bufferp, data + 9, rc32);
                filep->offset += rc32;
                bytes_in_buffer += rc32;
                sliding_bufferp += rc32;

                if(filep->data_len == 0)
                    /* free the allocated data if not stored to keep */
                    LIBSSH2_FREE(session, data);

                /* remove the chunk we just processed keeping track of the
                 * next one in case we need it */
                next = _libssh2_list_next(&chunk->node);
                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* check if we have space left in the buffer
                 * and either continue to the next chunk or stop
                 */
                if(bytes_in_buffer < buffer_size) {
                    chunk = next;
                }
                else {
                    chunk = NULL;
                }

                break;
            default:
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "SFTP Protocol badness: unrecognised "
                                      "read request response");
            }
        }

        if(bytes_in_buffer > 0)
            return bytes_in_buffer;

        break;

    default:
        assert(0);  /* State machine error; unrecognised read state */
    }

    /* we should never reach this point */
    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                          "sftp_read() internal error");
}